

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

void Abc_BufReplaceBufsByInvs(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Mio_Gate_t *pMVar2;
  Mio_Gate_t *pMVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pFaninOld;
  uint local_28;
  int local_24;
  int Counter;
  int i;
  Abc_Obj_t *pInv;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  local_28 = 0;
  local_24 = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= local_24) {
      printf("Replaced %d buffers by invertor pairs.\n",(ulong)local_28);
      return;
    }
    pObj_00 = Abc_NtkObj(pNtk,local_24);
    if (((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) &&
       (iVar1 = Abc_NodeIsBuf(pObj_00), iVar1 != 0)) {
      pMVar3 = (Mio_Gate_t *)(pObj_00->field_5).pData;
      pMVar2 = Mio_LibraryReadBuf((Mio_Library_t *)pNtk->pManFunc);
      if (pMVar3 != pMVar2) {
        __assert_fail("pObj->pData == Mio_LibraryReadBuf((Mio_Library_t *)pNtk->pManFunc)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                      ,0x32e,"void Abc_BufReplaceBufsByInvs(Abc_Ntk_t *)");
      }
      pMVar3 = Mio_LibraryReadInv((Mio_Library_t *)pNtk->pManFunc);
      (pObj_00->field_5).pData = pMVar3;
      pAVar4 = Abc_ObjFanin0(pObj_00);
      pAVar4 = Abc_NtkCreateNodeInv(pNtk,pAVar4);
      pFaninOld = Abc_ObjFanin0(pObj_00);
      Abc_ObjPatchFanin(pObj_00,pFaninOld,pAVar4);
      local_28 = local_28 + 1;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void Abc_BufReplaceBufsByInvs( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pInv;
    int i, Counter = 0;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsBuf(pObj) )
            continue;
        assert( pObj->pData == Mio_LibraryReadBuf((Mio_Library_t *)pNtk->pManFunc) );
        pObj->pData = Mio_LibraryReadInv((Mio_Library_t *)pNtk->pManFunc);
        pInv = Abc_NtkCreateNodeInv( pNtk, Abc_ObjFanin0(pObj) );
        Abc_ObjPatchFanin( pObj, Abc_ObjFanin0(pObj), pInv );
        Counter++;
    }
    printf( "Replaced %d buffers by invertor pairs.\n", Counter );
}